

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_with_snapshot_open_test(void)

{
  fdb_status fVar1;
  cb_args cb_args;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status s;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffc28;
  fdb_file_handle *in_stack_fffffffffffffc30;
  size_t in_stack_fffffffffffffc48;
  void *in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  void *in_stack_fffffffffffffc60;
  fdb_kvs_handle *in_stack_fffffffffffffc68;
  fdb_kvs_handle *local_278;
  char local_268 [56];
  fdb_kvs_config *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  fdb_kvs_handle **in_stack_fffffffffffffde0;
  fdb_file_handle *in_stack_fffffffffffffde8;
  fdb_config *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  fdb_file_handle **in_stack_fffffffffffffe58;
  fdb_file_handle local_168;
  fdb_seqnum_t in_stack_fffffffffffffed0;
  fdb_kvs_handle **in_stack_fffffffffffffed8;
  fdb_kvs_handle *in_stack_fffffffffffffee0;
  uint local_54;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  memset(&stack0xfffffffffffffc48,0,0x18);
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0);
  fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0);
  local_54 = 0;
  do {
    if (99999 < (int)local_54) {
      fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffc28,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xbfb);
        compact_with_snapshot_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xbfb,"void compact_with_snapshot_open_test()");
        }
      }
      fVar1 = fdb_compact(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc02);
        compact_with_snapshot_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xc02,"void compact_with_snapshot_open_test()");
        }
      }
      fVar1 = fdb_snapshot_open(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                in_stack_fffffffffffffed0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc06);
        compact_with_snapshot_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xc06,"void compact_with_snapshot_open_test()");
        }
      }
      fdb_kvs_close(in_stack_fffffffffffffc28);
      fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffc28);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc0a);
        compact_with_snapshot_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xc0a,"void compact_with_snapshot_open_test()");
        }
      }
      fVar1 = fdb_shutdown();
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xc0c);
        compact_with_snapshot_open_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xc0c,"void compact_with_snapshot_open_test()");
        }
      }
      if (compact_with_snapshot_open_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compact with snapshot_open test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compact with snapshot_open test");
      }
      return;
    }
    sprintf((char *)&local_168,"key%04d",(ulong)local_54);
    sprintf(local_268,"body%04d",(ulong)local_54);
    in_stack_fffffffffffffc30 = &local_168;
    in_stack_fffffffffffffc28 = local_278;
    strlen((char *)&local_168);
    strlen(local_268);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58
                       ,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xbf5);
      compact_with_snapshot_open_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xbf5,"void compact_with_snapshot_open_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void compact_with_snapshot_open_test()
{
  TEST_INIT();
  memleak_start();

  int i, r;
  int n = 100000;
  char keybuf[256], bodybuf[256];
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db, *db2, *snap_db;
  fdb_status s;
  fdb_config fconfig = fdb_get_default_config();
  fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
  struct cb_args cb_args;

  memset(&cb_args, 0x0, sizeof(struct cb_args));
  fconfig.wal_threshold = 1024;
  fconfig.flags = FDB_OPEN_FLAG_CREATE;
  fconfig.compaction_cb = compaction_cb_get;
  fconfig.compaction_cb_ctx = &cb_args;
  fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                               FDB_CS_MOVE_DOC |
                               FDB_CS_FLUSH_WAL |
                               FDB_CS_END;
  // remove previous compact_test files
  r = system(SHELL_DEL" compact_test* > errorlog.txt");
  (void)r;

  // open two handles for kvs
  fdb_open(&dbfile, "./compact_test1", &fconfig);
  fdb_kvs_open(dbfile, &db, "db", &kvs_config);
  fdb_kvs_open(dbfile, &db2, "db", &kvs_config);
  for (i=0;i<n;++i){
      sprintf(keybuf, "key%04d", i);
      sprintf(bodybuf, "body%04d", i);
      s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
      TEST_CHK(s == FDB_RESULT_SUCCESS);
  }


  // commit
  s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
  TEST_CHK(s == FDB_RESULT_SUCCESS);

  // point compact callback handle to db2
  cb_args.handle = db2;

  // compact
  s = fdb_compact(dbfile, NULL);
  TEST_CHK(s == FDB_RESULT_SUCCESS);

  // open compaction end
  s = fdb_snapshot_open(db2, &snap_db, n);
  TEST_CHK(s == FDB_RESULT_SUCCESS);

  fdb_kvs_close(snap_db);
  s = fdb_close(dbfile);
  TEST_CHK(s == FDB_RESULT_SUCCESS);
  s = fdb_shutdown();
  TEST_CHK(s == FDB_RESULT_SUCCESS);
  TEST_RESULT("compact with snapshot_open test");
}